

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_interference(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  AREA_DATA_conflict *area_00;
  bool bVar1;
  char *pcVar2;
  CHAR_DATA *in_RDX;
  int in_EDI;
  char buf [4608];
  AFFECT_DATA af;
  AREA_DATA_conflict *area;
  AREA_AFFECT_DATA aaf;
  undefined4 in_stack_ffffffffffffed18;
  int in_stack_ffffffffffffed1c;
  int in_stack_ffffffffffffed20;
  undefined4 in_stack_ffffffffffffed24;
  CHAR_DATA *in_stack_ffffffffffffed28;
  char *in_stack_ffffffffffffed30;
  
  area_00 = in_RDX->in_room->area;
  bVar1 = is_affected(in_RDX,in_EDI);
  if (bVar1) {
    send_to_char(in_stack_ffffffffffffed30,in_stack_ffffffffffffed28);
  }
  else {
    bVar1 = is_affected_area(area_00,(int)gsn_interference);
    if (bVar1) {
      send_to_char(in_stack_ffffffffffffed30,in_stack_ffffffffffffed28);
    }
    else {
      init_affect_area((AREA_AFFECT_DATA *)0x6d97ee);
      dice(in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      affect_to_area((AREA_DATA_conflict *)
                     CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                     (AREA_AFFECT_DATA *)
                     CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
      init_affect((AFFECT_DATA *)0x6d989f);
      affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                     (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
      send_to_char(in_stack_ffffffffffffed30,in_stack_ffffffffffffed28);
      pcVar2 = "air";
      if (in_RDX->in_room->sector_type == 8) {
        pcVar2 = "water";
      }
      snprintf(&stack0xffffffffffffed18,0x1200,
               "{yA smell of ozone fills the %s as electricity crackles around you.{x",pcVar2);
      rarea_echo((ROOM_INDEX_DATA *)buf._4400_8_,(char *)buf._4392_8_);
    }
  }
  return;
}

Assistant:

void spell_interference(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AREA_AFFECT_DATA aaf;
	AREA_DATA *area;
	AFFECT_DATA af;
	char buf[MAX_STRING_LENGTH];

	area = ch->in_room->area;

	if (is_affected(ch, sn))
	{
		send_to_char("You cannot conjure more electrical interference yet.\n\r", ch);
		return;
	}

	if (is_affected_area(area, gsn_interference))
	{
		send_to_char("This area is already blanketed by a veil of electrical interference.\n\r", ch);
		return;
	}

	init_affect_area(&aaf);
	aaf.where = TO_ROOM_AFFECTS;
	aaf.type = gsn_interference;
	aaf.aftype = AFT_SPELL;
	aaf.level = level;
	aaf.duration = dice(2, 3) + 5;
	aaf.location = 0;
	aaf.modifier = 0;
	aaf.owner = ch;
	aaf.tick_fun = nullptr;
	aaf.end_fun = interference_end;
	affect_to_area(area, &aaf);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_interference;
	af.aftype = AFT_TIMER;
	af.duration = 48;
	af.location = 0;
	af.modifier = 0;
	af.owner = ch;
	affect_to_char(ch, &af);

	send_to_char("You blanket the area with a veil of electrical interference.\n\r", ch);
	std::snprintf(buf, static_cast<int>(MSL), "{yA smell of ozone fills the %s as electricity crackles around you.{x",
		ch->in_room->sector_type == SECT_UNDERWATER ? "water" : "air");

	rarea_echo(ch->in_room, buf);
}